

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O3

void __thiscall
Variable_parentlessUsingRemoveVariable_Test::TestBody
          (Variable_parentlessUsingRemoveVariable_Test *this)

{
  string *psVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  VariablePtr v1;
  ComponentPtr comp1;
  ModelPtr m;
  long *local_80;
  shared_ptr<libcellml::ParentedEntity> local_78;
  AssertionResult local_68;
  long local_58 [2];
  AssertHelper local_48 [8];
  string *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Model::create();
  libcellml::Component::create();
  libcellml::Variable::create();
  psVar1 = local_20;
  local_68._0_8_ = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"modelName","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_68._0_8_ != local_58) {
    operator_delete((void *)local_68._0_8_,local_58[0] + 1);
  }
  psVar1 = local_30;
  local_68._0_8_ = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"component1","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_68._0_8_ != local_58) {
    operator_delete((void *)local_68._0_8_,local_58[0] + 1);
  }
  psVar1 = local_40;
  local_68._0_8_ = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"variable1","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_68._0_8_ != local_58) {
    operator_delete((void *)local_68._0_8_,local_58[0] + 1);
  }
  local_68._0_8_ = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"dimensionless","");
  libcellml::Variable::setUnits(local_40);
  if ((long *)local_68._0_8_ != local_58) {
    operator_delete((void *)local_68._0_8_,local_58[0] + 1);
  }
  libcellml::Component::addVariable((shared_ptr *)local_30);
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_20);
  cVar2 = libcellml::ParentedEntity::hasParent();
  local_78.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT71(local_78.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._1_7_,cVar2);
  local_78.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (cVar2 == '\0') {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(char *)&local_78,"v1->hasParent()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x4ba,(char *)local_68._0_8_);
    testing::internal::AssertHelper::operator=(local_48,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    if ((long *)local_68._0_8_ != local_58) {
      operator_delete((void *)local_68._0_8_,local_58[0] + 1);
    }
    if (local_80 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Component::removeVariable((shared_ptr *)local_30);
  local_78.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_80 = (long *)libcellml::Component::variableCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_68,"size_t(0)","comp1->variableCount()",(unsigned_long *)&local_78,
             (unsigned_long *)&local_80);
  if ((string)local_68.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_68.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_68.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x4be,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if (local_78.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         (local_78.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0)) {
        (**(code **)(*(long *)local_78.
                              super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cVar2 = libcellml::ParentedEntity::hasParent();
  local_78.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (CONCAT71(local_78.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._1_7_,cVar2) ^ 1);
  local_78.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (cVar2 != '\0') {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(char *)&local_78,"v1->hasParent()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x4bf,(char *)local_68._0_8_);
    testing::internal::AssertHelper::operator=(local_48,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    if ((long *)local_68._0_8_ != local_58) {
      operator_delete((void *)local_68._0_8_,local_58[0] + 1);
    }
    if (local_80 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80 = (long *)0x0;
  libcellml::ParentedEntity::parent();
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::ParentedEntity>>
            ((internal *)&local_68,"nullptr","v1->parent()",&local_80,&local_78);
  if (local_78.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((string)local_68.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_68.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_68.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x4c0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if (local_78.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         (local_78.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0)) {
        (**(code **)(*(long *)local_78.
                              super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

TEST(Variable, parentlessUsingRemoveVariable)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr comp1 = libcellml::Component::create();

    libcellml::VariablePtr v1 = libcellml::Variable::create();

    m->setName("modelName");
    comp1->setName("component1");

    v1->setName("variable1");

    v1->setUnits("dimensionless");

    comp1->addVariable(v1);
    m->addComponent(comp1);

    EXPECT_TRUE(v1->hasParent());
    // Make a variable without a parent component.
    comp1->removeVariable(v1);

    EXPECT_EQ(size_t(0), comp1->variableCount());
    EXPECT_FALSE(v1->hasParent());
    EXPECT_EQ(nullptr, v1->parent());
}